

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O3

void destroy_GL_context(SWindowData *window_data)

{
  glXDestroyContext(*(undefined8 *)((long)window_data->specific + 8),
                    *(undefined8 *)((long)window_data->specific + 0x20));
  return;
}

Assistant:

void
destroy_GL_context(SWindowData *window_data) {
#if defined(_WIN32) || defined(WIN32)

    SWindowData_Win *window_data_win = (SWindowData_Win *) window_data->specific;
    if (window_data_win->hGLRC) {
        wglMakeCurrent(NULL, NULL);
        wglDeleteContext(window_data_win->hGLRC);
        window_data_win->hGLRC = 0;
    }

#elif defined(linux)

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    glXDestroyContext(window_data_x11->display, window_data_x11->context);

#endif
}